

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

bool BicTest3<Blob<128>,unsigned_long>(pfHash hash,int reps,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  int iVar4;
  ulong uVar5;
  byte in_DL;
  int in_ESI;
  code *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool result;
  int i;
  double b2;
  int b_1;
  double bias;
  int *bins_1;
  int *page_1;
  int keybit_1;
  int out2_1;
  int out1_1;
  uint32_t x;
  int *b;
  int out2;
  int out1;
  unsigned_long d;
  int irep;
  int *page;
  int keybit;
  vector<int,_std::allocator<int>_> bins;
  unsigned_long h2;
  unsigned_long h1;
  Blob<128> key;
  int maxB;
  int maxA;
  int maxK;
  double maxBias;
  Rand r;
  int pagesize;
  int hashbits;
  int hashbytes;
  int keybits;
  int keybytes;
  uint32_t in_stack_fffffffffffffedc;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  byte bVar8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  vector<int,_std::allocator<int>_> *this;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Rand *in_stack_ffffffffffffff00;
  int local_f4;
  double local_f0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint32_t local_c0;
  uint32_t local_bc;
  ulong local_b8;
  int local_ac;
  reference local_a8;
  int local_a0;
  undefined1 local_8d [29];
  ulong local_70;
  ulong local_68;
  Blob<128> local_5c;
  uint local_4c;
  uint local_48;
  uint local_44;
  double local_40;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_d;
  int local_c;
  code *local_8;
  
  local_d = in_DL & 1;
  local_14 = 0x10;
  local_18 = 0x80;
  local_1c = 8;
  local_20 = 0x40;
  local_24 = 0x4000;
  local_c = in_ESI;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc);
  local_40 = 0.0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  Blob<128>::Blob(&local_5c);
  local_8d._1_4_ = 0;
  this = (vector<int,_std::allocator<int>_> *)local_8d;
  std::allocator<int>::allocator((allocator<int> *)0x14f761);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (value_type_conflict *)this,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::allocator<int>::~allocator((allocator<int> *)0x14f78f);
  for (local_a0 = 0; local_a0 < 0x80; local_a0 = local_a0 + 1) {
    if (local_a0 % 0xc == 0) {
      printf(".");
    }
    local_a8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8d + 5),
                          (long)(local_a0 << 0xe));
    for (local_ac = 0; local_ac < local_c; local_ac = local_ac + 1) {
      Rand::rand_p(in_stack_ffffffffffffff00,
                   (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (int)((ulong)this >> 0x20));
      (*local_8)(&local_5c,0x10,0,&local_68);
      flipbit<Blob<128>>((Blob<128> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
      (*local_8)(&local_5c,0x10,0,&local_70);
      local_b8 = local_68 ^ local_70;
      for (local_bc = 0; local_c0 = local_bc, (int)local_bc < 0x3f; local_bc = local_bc + 1) {
        while (pvVar3 = local_a8, local_c0 = local_c0 + 1, (int)local_c0 < 0x40) {
          iVar4 = local_bc * 0x40 + local_c0;
          uVar1 = getbit<unsigned_long>(&local_b8,local_bc);
          uVar2 = getbit<unsigned_long>(&local_b8,local_c0);
          uVar5 = (ulong)(uVar1 | uVar2 << 1);
          pvVar3[(long)(iVar4 * 4) + uVar5] = pvVar3[(long)(iVar4 * 4) + uVar5] + 1;
        }
      }
    }
  }
  printf("\n");
  for (local_d0 = 0; local_d4 = local_d0, (int)local_d0 < 0x3f; local_d0 = local_d0 + 1) {
    while (local_d4 = local_d4 + 1, (int)local_d4 < 0x40) {
      if ((local_d & 1) != 0) {
        printf("(%3d,%3d) - ",(ulong)local_d0,(ulong)local_d4);
      }
      for (local_d8 = 0; (int)local_d8 < 0x80; local_d8 = local_d8 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_8d + 5),
                            (long)(int)(local_d8 << 0xe));
        local_f0 = 0.0;
        for (local_f4 = 0; local_f4 < 4; local_f4 = local_f4 + 1) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (double)pvVar3[(long)(int)((local_d0 * 0x40 + local_d4) * 4) +
                                        (long)local_f4] / (double)(local_c / 2);
          auVar6 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar6,ZEXT816(0xbff0000000000000));
          auVar7._8_8_ = 0x7fffffffffffffff;
          auVar7._0_8_ = 0x7fffffffffffffff;
          auVar6 = vpand_avx(auVar6,auVar7);
          if (local_f0 < auVar6._0_8_) {
            local_f0 = auVar6._0_8_;
          }
        }
        if (local_40 < local_f0) {
          local_40 = local_f0;
          local_44 = local_d8;
          local_48 = local_d0;
          local_4c = local_d4;
        }
        if ((local_d & 1) != 0) {
          if (0.01 <= local_f0) {
            if (0.05 <= local_f0) {
              if (0.33 <= local_f0) {
                printf("X");
              }
              else {
                printf("O");
              }
            }
            else {
              printf("o");
            }
          }
          else {
            printf(".");
          }
        }
      }
      if ((local_d & 1) != 0) {
        printf("\n");
      }
    }
    if ((local_d & 1) != 0) {
      for (iVar4 = 0; iVar4 < 0x8c; iVar4 = iVar4 + 1) {
        printf("-");
      }
      printf("\n");
    }
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",local_40,(ulong)local_44,(ulong)local_48,(ulong)local_4c)
  ;
  bVar8 = local_40 < 0.05;
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return (bool)(bVar8 & 1);
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}